

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag_fsm.cpp
# Opt level: O2

State Jtag_fsm::getTransition(State state,bool tms)

{
  State SVar1;
  State SVar2;
  
  switch(state) {
  case TEST_LOGIC_RESET:
    return (State)!tms;
  case RUN_TEST_IDLE:
  case UPDATE_DR:
  case UPDATE_IR:
    return tms + RUN_TEST_IDLE;
  case SELECT_DR_SCAN:
    SVar2 = SELECT_IR_SCAN;
    SVar1 = CAPTURE_DR;
    break;
  case CAPTURE_DR:
  case SHIFT_DR:
    return tms | SHIFT_DR;
  case EXIT1_DR:
    return (uint)tms * 2 + PAUSE_DR;
  case PAUSE_DR:
    return tms | PAUSE_DR;
  case EXIT2_DR:
    return (uint)tms * 4 + SHIFT_DR;
  case SELECT_IR_SCAN:
    SVar2 = TEST_LOGIC_RESET;
    SVar1 = CAPTURE_IR;
    break;
  case CAPTURE_IR:
  case SHIFT_IR:
    return tms + SHIFT_IR;
  case EXIT1_IR:
    return (uint)tms * 2 + PAUSE_IR;
  case PAUSE_IR:
    return tms + PAUSE_IR;
  case EXIT2_IR:
    return (uint)tms * 4 + SHIFT_IR;
  default:
    return TEST_LOGIC_RESET;
  }
  if (tms) {
    SVar1 = SVar2;
  }
  return SVar1;
}

Assistant:

Jtag_fsm::State Jtag_fsm::getTransition(State state, bool tms) {
	switch (state) {
	case TEST_LOGIC_RESET:
		return tms ? TEST_LOGIC_RESET : RUN_TEST_IDLE;
	case RUN_TEST_IDLE:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	case SELECT_DR_SCAN:
		return tms ? SELECT_IR_SCAN : CAPTURE_DR;
	case CAPTURE_DR:
		return tms ? EXIT1_DR : SHIFT_DR;
	case SHIFT_DR:
		return tms ? EXIT1_DR : SHIFT_DR;
	case EXIT1_DR:
		return tms ? UPDATE_DR : PAUSE_DR;
	case PAUSE_DR:
		return tms ? EXIT2_DR : PAUSE_DR;
	case EXIT2_DR:
		return tms ? UPDATE_DR : SHIFT_DR;
	case UPDATE_DR:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	case SELECT_IR_SCAN:
		return tms ? TEST_LOGIC_RESET : CAPTURE_IR;
	case CAPTURE_IR:
		return tms ? EXIT1_IR : SHIFT_IR;
	case SHIFT_IR:
		return tms ? EXIT1_IR : SHIFT_IR;
	case EXIT1_IR:
		return tms ? UPDATE_IR : PAUSE_IR;
	case PAUSE_IR:
		return tms ? EXIT2_IR : PAUSE_IR;
	case EXIT2_IR:
		return tms ? UPDATE_IR : SHIFT_IR;
	case UPDATE_IR:
		return tms ? SELECT_DR_SCAN : RUN_TEST_IDLE;
	}

	return TEST_LOGIC_RESET;
}